

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathexpander.cpp
# Opt level: O0

FString BuildPath(FString *base,char *name)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RDX;
  char *name_local;
  FString *base_local;
  FString *current;
  
  FString::FString(base);
  bVar1 = FString::IsNotEmpty((FString *)name);
  if (bVar1) {
    FString::operator=(base,(FString *)name);
    sVar2 = FString::Len(base);
    pcVar3 = FString::operator[](base,sVar2 - 1);
    if (*pcVar3 != '/') {
      FString::operator+=(base,'/');
    }
  }
  FString::operator+=(base,in_RDX);
  return (FString)(char *)base;
}

Assistant:

static FString BuildPath(const FString &base, const char *name)
{
	FString current;
	if (base.IsNotEmpty())
	{
		current = base;
		if (current[current.Len() - 1] != '/') current += '/';
	}
	current += name;
	return current;
}